

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O1

bool __thiscall SQVM::StringCat(SQVM *this,SQObjectPtr *str,SQObjectPtr *obj,SQObjectPtr *dest)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQTable *pSVar3;
  bool bVar4;
  SQString *pSVar5;
  SQObjectPtr b;
  SQObjectPtr a;
  SQObjectPtr local_38;
  SQObjectPtr local_28;
  
  local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_28.super_SQObject._type = OT_NULL;
  local_38.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_38.super_SQObject._type = OT_NULL;
  bVar4 = ToString(this,str,&local_28);
  if (bVar4) {
    bVar4 = ToString(this,obj,&local_38);
    if (bVar4) {
      pSVar5 = SQString::Concat(this->_sharedstate,(local_28.super_SQObject._unVal.pString)->_val,
                                (local_28.super_SQObject._unVal.pString)->_len,
                                (local_38.super_SQObject._unVal.pString)->_val,
                                (local_38.super_SQObject._unVal.pString)->_len);
      pSVar3 = (dest->super_SQObject)._unVal.pTable;
      SVar2 = (dest->super_SQObject)._type;
      (dest->super_SQObject)._type = OT_STRING;
      (dest->super_SQObject)._unVal.pString = pSVar5;
      pSVar1 = &(pSVar5->super_SQRefCounted)._uiRef;
      *pSVar1 = *pSVar1 + 1;
      bVar4 = true;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar3->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      goto LAB_0012cf55;
    }
  }
  bVar4 = false;
LAB_0012cf55:
  SQObjectPtr::~SQObjectPtr(&local_38);
  SQObjectPtr::~SQObjectPtr(&local_28);
  return bVar4;
}

Assistant:

bool SQVM::StringCat(const SQObjectPtr &str,const SQObjectPtr &obj,SQObjectPtr &dest)
{
    SQObjectPtr a, b;
    if(!ToString(str, a)) return false;
    if(!ToString(obj, b)) return false;
    SQInteger l = _string(a)->_len , ol = _string(b)->_len;
#ifdef SQ_NO_FAST_STRINGCAT
    SQChar* s = _sp(sq_rsl(l + ol + 1));
    memcpy(s, _stringval(a), sq_rsl(l));
    memcpy(s + l, _stringval(b), sq_rsl(ol));
    dest = SQString::Create(_ss(this), _spval, l + ol);
#else
    dest = SQString::Concat(_ss(this),_stringval(a),l,_stringval(b),ol);
#endif
    return true;
}